

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void sysbvm_identityDictionary_add
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t association)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  sysbvm_tuple_t element;
  ulong uVar5;
  int64_t svalue;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    if (((association & 0xf) == 0 && association != 0) && (7 < *(uint *)(association + 0xc))) {
      element = *(sysbvm_tuple_t *)(association + 0x10);
    }
    else {
      element = 0;
    }
    lVar3 = sysbvm_identityDictionary_scanFor(dictionary,element);
    if (lVar3 < 0) {
      sysbvm_identityDictionary_increaseCapacity(context,dictionary);
      lVar3 = sysbvm_identityDictionary_scanFor(dictionary,element);
      if (lVar3 < 0) {
        sysbvm_error("Dictionary out of memory.");
        lVar3 = -1;
      }
    }
    lVar1 = *(long *)(*(long *)(dictionary + 0x18) + 0x10 + lVar3 * 8);
    *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + lVar3 * 8) = association;
    if (lVar1 == 0) {
      uVar5 = *(ulong *)(dictionary + 0x18);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar5 = 0;
      }
      uVar2 = *(ulong *)(dictionary + 0x10);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        lVar3 = (long)uVar2 >> 4;
      }
      else {
        lVar3 = *(long *)(uVar2 + 0x10);
      }
      uVar2 = lVar3 + 1;
      if (lVar3 + 0x800000000000001U >> 0x3c == 0) {
        uVar4 = uVar2 * 0x10 | 0xb;
      }
      else {
        uVar4 = sysbvm_tuple_uint64_encodeBig(context,uVar2);
      }
      *(ulong *)(dictionary + 0x10) = uVar4;
      if (uVar5 <= uVar2) {
        sysbvm_identityDictionary_increaseCapacity(context,dictionary);
        return;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identityDictionary_add(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t association)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    sysbvm_tuple_t key = sysbvm_association_getKey(association);
    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_identityDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(storage->elements[elementIndex])
    {
        storage->elements[elementIndex] = association;
    }
    else
    {
        storage->elements[elementIndex] = association;
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identityDictionary_increaseCapacity(context, dictionary);
    }
}